

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MapFieldBase::InsertOrLookupMapValueNoSync
          (MapFieldBase *this,MapKey *map_key,MapValueRef *val)

{
  UntypedMapBase *this_00;
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  NodeBase *node_00;
  bool *pbVar4;
  double *pdVar5;
  float *pfVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  MessageLite *msg;
  NodeBase *node;
  MapFieldBase *local_50;
  undefined1 *local_48;
  string_view local_40;
  
  bVar1 = LookupMapValueNoSync(this,map_key,&val->super_MapValueConstRef);
  if (bVar1) goto LAB_00208f3c;
  this_00 = (UntypedMapBase *)(this + 1);
  node_00 = UntypedMapBase::AllocNode(this_00);
  node = node_00;
  switch(*(byte *)((long)&this[1].super_MapFieldBaseForParse.prototype_as_void_ + 7) >> 4) {
  case 0:
    pbVar4 = UntypedMapBase::GetValue<bool>(this_00,node_00);
    *pbVar4 = false;
    break;
  case 1:
    pfVar6 = (float *)UntypedMapBase::GetValue<unsigned_int>(this_00,node_00);
    goto LAB_00208e16;
  case 2:
    pdVar5 = (double *)UntypedMapBase::GetValue<unsigned_long>(this_00,node_00);
    goto LAB_00208df8;
  case 3:
    pfVar6 = UntypedMapBase::GetValue<float>(this_00,node_00);
LAB_00208e16:
    *pfVar6 = 0.0;
    break;
  case 4:
    pdVar5 = UntypedMapBase::GetValue<double>(this_00,node_00);
LAB_00208df8:
    *pdVar5 = 0.0;
    break;
  case 5:
    pbVar7 = UntypedMapBase::GetValue<std::__cxx11::string>(this_00,node_00);
    InitializeKeyValue<std::__cxx11::string>(this,pbVar7);
    break;
  case 6:
    msg = UntypedMapBase::GetValue<google::protobuf::MessageLite>(this_00,node_00);
    InitializeKeyValue(this,msg);
    break;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                ,0x207);
  }
  (val->super_MapValueConstRef).data_ =
       (void *)((long)&node_00->next +
               (ulong)*(byte *)((long)&this[1].super_MapFieldBaseForParse.prototype_as_void_ + 6));
  local_50 = this;
  local_48 = (undefined1 *)&node;
  CVar3 = MapKey::type(map_key);
  switch(CVar3) {
  case CPPTYPE_INT32:
    local_40._M_len._0_4_ = MapKey::GetInt32Value(map_key);
    break;
  case CPPTYPE_INT64:
    local_40._M_len = MapKey::GetInt64Value(map_key);
    goto LAB_00208f27;
  case CPPTYPE_UINT32:
    local_40._M_len._0_4_ = MapKey::GetUInt32Value(map_key);
    break;
  case CPPTYPE_UINT64:
    local_40._M_len = MapKey::GetUInt64Value(map_key);
LAB_00208f27:
    InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)::
    $_1::operator()(&local_50,(KeyMapBase<unsigned_long> *)this_00,&local_40._M_len);
    goto LAB_00208f3c;
  default:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
                ,0x46);
  case CPPTYPE_BOOL:
    bVar2 = MapKey::GetBoolValue(map_key);
    pbVar4 = UntypedMapBase::GetKey<bool>(this_00,node);
    *pbVar4 = bVar2;
    KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)this_00,(KeyNode *)node);
    goto LAB_00208f3c;
  case CPPTYPE_STRING:
    local_40 = MapKey::GetStringValue(map_key);
    pbVar7 = UntypedMapBase::GetKey<std::__cxx11::string>(this_00,node);
    InitializeKeyValue<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
              (this,pbVar7,&local_40);
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00,(KeyNode *)node);
    goto LAB_00208f3c;
  }
  InsertOrLookupMapValueNoSync(google::protobuf::MapKey_const&,google::protobuf::MapValueRef*)::$_1
  ::operator()(&local_50,(KeyMapBase<unsigned_int> *)this_00,(uint *)&local_40);
LAB_00208f3c:
  return !bVar1;
}

Assistant:

bool MapFieldBase::InsertOrLookupMapValueNoSync(const MapKey& map_key,
                                                MapValueRef* val) {
  if (LookupMapValueNoSync(map_key, static_cast<MapValueConstRef*>(val))) {
    return false;
  }

  auto& map = GetMapRaw();

  NodeBase* node = map.AllocNode();
  map.VisitValue(node, [&](auto* v) { InitializeKeyValue(v); });
  val->SetValue(map.GetVoidValue(node));

  return VisitMapKey(map_key, map, [&](auto& map, const auto& key) {
    InitializeKeyValue(map.GetKey(node), key);
    map.InsertOrReplaceNode(
        static_cast<typename std::decay_t<decltype(map)>::KeyNode*>(node));
    return true;
  });
}